

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O3

Amount __thiscall cfd::FeeCalculator::GetFee(FeeCalculator *this,Utxo *utxo)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  Amount AVar4;
  
  uVar1 = core::AbstractTransaction::GetVsizeFromSize
                    (utxo->uscript_size_max + 0x29,(uint)utxo->witness_size_max);
  uVar2 = (ulong)uVar1 * (ulong)this->baserate_;
  uVar3 = uVar2 * 0x1cac083126e978d5;
  uVar3 = (ulong)(0x4189374bc6a7ef < (uVar3 >> 3 | uVar3 << 0x3d)) + uVar2 / 1000;
  uVar2 = (ulong)((ulong)this->baserate_ != 0);
  if (uVar3 != 0) {
    uVar2 = uVar3;
  }
  if (uVar1 == 0) {
    uVar2 = uVar3;
  }
  AVar4 = core::Amount::CreateBySatoshiAmount(uVar2);
  return AVar4;
}

Assistant:

Amount FeeCalculator::GetFee(const Utxo& utxo) const {
  uint32_t minimum_txin = static_cast<uint32_t>(TxIn::kMinimumTxInSize);
  uint32_t nowit_size = minimum_txin + utxo.uscript_size_max;
  uint32_t vsize =
      AbstractTransaction::GetVsizeFromSize(nowit_size, utxo.witness_size_max);
  return GetFee(vsize);
}